

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3VListNumToName(VList *pIn,int iVal)

{
  int local_20;
  int mx;
  int i;
  int iVal_local;
  VList *pIn_local;
  
  if (pIn != (VList *)0x0) {
    local_20 = 2;
    do {
      if (pIn[local_20] == iVal) {
        return (char *)(pIn + (local_20 + 2));
      }
      local_20 = pIn[local_20 + 1] + local_20;
    } while (local_20 < pIn[1]);
  }
  return (char *)0x0;
}

Assistant:

SQLITE_PRIVATE const char *sqlite3VListNumToName(VList *pIn, int iVal){
  int i, mx;
  if( pIn==0 ) return 0;
  mx = pIn[1];
  i = 2;
  do{
    if( pIn[i]==iVal ) return (char*)&pIn[i+2];
    i += pIn[i+1];
  }while( i<mx );
  return 0;
}